

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O1

void __thiscall Util::PermuteSudoku(Util *this,char *puzzle,bool pencilmark)

{
  int iVar1;
  int iVar2;
  pointer pcVar3;
  int row;
  long lVar4;
  char *pcVar5;
  undefined7 in_register_00000011;
  char *pcVar6;
  long lVar7;
  int digit;
  long lVar8;
  char cVar9;
  size_type __new_size;
  vector<char,_std::allocator<char>_> out_puzzle;
  array<int,_9UL> digit_permutation;
  array<int,_9UL> col_permutation;
  array<int,_9UL> row_permutation;
  char acStack_17c [156];
  undefined8 uStack_e0;
  vector<char,_std::allocator<char>_> local_d8;
  int local_b8 [12];
  array<int,_9UL> local_88;
  array<int,_9UL> local_58;
  
  local_b8[0] = 0;
  local_b8[1] = 1;
  local_b8[2] = 2;
  local_b8[3] = 3;
  local_b8[4] = 4;
  local_b8[5] = 5;
  local_b8[6] = 6;
  local_b8[7] = 7;
  local_b8[8] = 8;
  uStack_e0 = 0x1077c9;
  std::
  shuffle<int*,std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>&>
            (local_b8,local_b8 + 9,&this->rng_);
  local_58._M_elems[0] = 0;
  local_58._M_elems[1] = 1;
  local_58._M_elems[2] = 2;
  local_58._M_elems[3] = 3;
  local_58._M_elems[4] = 4;
  local_58._M_elems[5] = 5;
  local_58._M_elems[6] = 6;
  local_58._M_elems[7] = 7;
  local_58._M_elems[8] = 8;
  local_88._M_elems[0] = 0;
  local_88._M_elems[1] = 1;
  local_88._M_elems[2] = 2;
  local_88._M_elems[3] = 3;
  local_88._M_elems[4] = 4;
  local_88._M_elems[5] = 5;
  local_88._M_elems[6] = 6;
  local_88._M_elems[7] = 7;
  local_88._M_elems[8] = 8;
  uStack_e0 = 0x1077fa;
  BlockShuffle(this,&local_88);
  uStack_e0 = 0x107805;
  BlockShuffle(this,&local_58);
  __new_size = 0x51;
  if ((int)CONCAT71(in_register_00000011,pencilmark) != 0) {
    __new_size = 0x2d9;
  }
  local_d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (char *)0x0;
  local_d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  uStack_e0 = 0x107831;
  std::vector<char,_std::allocator<char>_>::resize(&local_d8,__new_size);
  pcVar3 = local_d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
           _M_start;
  lVar4 = 0;
  pcVar5 = puzzle;
  do {
    lVar7 = 0;
    pcVar6 = pcVar5;
    do {
      if (pencilmark) {
        iVar1 = local_58._M_elems[lVar4];
        iVar2 = local_88._M_elems[lVar7];
        lVar8 = 0;
        do {
          cVar9 = '.';
          if (pcVar6[lVar8] != '.') {
            cVar9 = (char)local_b8[lVar8] + '1';
          }
          local_d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start[(long)local_b8[lVar8] + (long)iVar2 * 9 + (long)iVar1 * 0x51] = cVar9;
          lVar8 = lVar8 + 1;
        } while (lVar8 != 9);
      }
      else {
        cVar9 = puzzle[lVar7 + lVar4 * 9];
        if ((long)cVar9 != 0x2e) {
          cVar9 = acStack_17c[(long)cVar9 * 4] + '1';
        }
        local_d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start[(long)local_88._M_elems[lVar7] + (long)local_58._M_elems[lVar4] * 9] = cVar9;
      }
      lVar7 = lVar7 + 1;
      pcVar6 = pcVar6 + 9;
    } while (lVar7 != 9);
    lVar4 = lVar4 + 1;
    pcVar5 = pcVar5 + 0x51;
  } while (lVar4 != 9);
  uStack_e0 = 0x1078fb;
  strncpy(puzzle,local_d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start,__new_size);
  if (pcVar3 != (char *)0x0) {
    uStack_e0 = 0x107910;
    operator_delete(pcVar3,(long)local_d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pcVar3);
  }
  return;
}

Assistant:

void Util::PermuteSudoku(char *puzzle, bool pencilmark) {
    array<int, 9> digit_permutation{0, 1, 2, 3, 4, 5, 6, 7, 8};
    shuffle(digit_permutation.begin(), digit_permutation.end(), rng_);

    array<int, 9> row_permutation{0, 1, 2, 3, 4, 5, 6, 7, 8};
    array<int, 9> col_permutation{0, 1, 2, 3, 4, 5, 6, 7, 8};
    BlockShuffle(&col_permutation);
    BlockShuffle(&row_permutation);

    size_t row_size = pencilmark ? 81 : 9;
    size_t puzzle_size = row_size * 9;

    vector<char> out_puzzle;
    out_puzzle.resize(puzzle_size);

    for (int row = 0; row < 9; row++) {
        for (int col = 0; col < 9; col++) {
            if (pencilmark) {
                for (int digit = 0; digit < 9; digit++) {
                    bool eliminated = puzzle[row * 81 + col * 9 + digit] == '.';
                    out_puzzle[row_permutation[row] * 81 +
                               col_permutation[col] * 9 +
                               digit_permutation[digit]] =
                            eliminated ? '.' : (char) ('1' + digit_permutation[digit]);
                }
            } else {
                char digit = puzzle[row * 9 + col];
                if (digit != '.') {
                    digit = (char) ('1' + digit_permutation[digit - '1']);
                }
                out_puzzle[row_permutation[row] * 9 + col_permutation[col]] = digit;
            }
        }
    }
    strncpy(puzzle, &out_puzzle[0], puzzle_size);
}